

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall JsonNumber_IntegerMax_Test::TestBody(JsonNumber_IntegerMax_Test *this)

{
  bool bVar1;
  MockSpec<std::error_code_(unsigned_long)> *this_00;
  TypedExpectation<std::error_code_(unsigned_long)> *this_01;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_02;
  char *message;
  char *in_R9;
  string local_170;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_;
  undefined1 local_120 [8];
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  Matcher<unsigned_long> local_70;
  MockSpec<std::error_code_(unsigned_long)> local_58;
  undefined1 local_38 [8];
  string str_max;
  long long_max;
  JsonNumber_IntegerMax_Test *this_local;
  
  str_max.field_2._8_8_ = 0x7fffffffffffffff;
  std::__cxx11::to_string((string *)local_38,0x7fffffffffffffff);
  testing::Matcher<unsigned_long>::Matcher(&local_70,0x7fffffffffffffff);
  mock_json_callbacks::gmock_uint64_value
            (&local_58,&(this->super_JsonNumber).callbacks_.super_mock_json_callbacks,&local_70);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::operator()
                      (&local_58,(WithoutMatchers *)((long)&p.coordinate_.column + 3),(void *)0x0);
  this_01 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
                       ,0xb5,"callbacks_","uint64_value (long_max)");
  testing::internal::TypedExpectation<std::error_code_(unsigned_long)>::Times(this_01,1);
  testing::internal::MockSpec<std::error_code_(unsigned_long)>::~MockSpec(&local_58);
  testing::Matcher<unsigned_long>::~Matcher(&local_70);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(this->super_JsonNumber).proxy_.original_;
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_120,
             (callbacks_proxy<mock_json_callbacks>)
             gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,none);
  this_02 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_120,(string *)local_38
                      );
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_02);
  local_139 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::has_error
                        ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_120);
  local_139 = !local_139;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)local_138,(AssertionResult *)"p.has_error ()","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
               ,0xb8,message);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_120);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TEST_F (JsonNumber, IntegerMax) {
    constexpr auto long_max = std::numeric_limits<std::int64_t>::max ();
    auto const str_max = std::to_string (long_max);

    EXPECT_CALL (callbacks_, uint64_value (long_max)).Times (1);
    json::parser<decltype (proxy_)> p (proxy_);
    p.input (str_max).eof ();
    EXPECT_FALSE (p.has_error ());
}